

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cavity.c
# Opt level: O0

REF_STATUS ref_cavity_ratio(REF_CAVITY ref_cavity,REF_BOOL *allowed)

{
  double *pdVar1;
  bool bVar2;
  uint uVar3;
  REF_STATUS ref_private_macro_code_rss;
  REF_BOOL skip;
  REF_INT face_node;
  REF_INT face;
  REF_DBL ratio;
  REF_NODE pRStack_30;
  REF_INT node;
  REF_NODE ref_node;
  REF_GRID ref_grid;
  REF_BOOL *allowed_local;
  REF_CAVITY ref_cavity_local;
  
  ref_node = (REF_NODE)ref_cavity->ref_grid;
  pRStack_30 = ((REF_GRID)ref_node)->node;
  ratio._4_4_ = ref_cavity->node;
  *allowed = 1;
  skip = 0;
  ref_grid = (REF_GRID)allowed;
  allowed_local = (REF_BOOL *)ref_cavity;
  do {
    if (allowed_local[0xd] <= skip) {
      return 0;
    }
    if (((-1 < skip) && (skip < allowed_local[0xd])) &&
       (*(int *)(*(long *)(allowed_local + 0x10) + (long)(skip * 3) * 4) != -1)) {
      bVar2 = false;
      for (ref_private_macro_code_rss = 0; ref_private_macro_code_rss < 3;
          ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
        if (ratio._4_4_ ==
            *(int *)(*(long *)(allowed_local + 0x10) +
                    (long)(ref_private_macro_code_rss + skip * 3) * 4)) {
          bVar2 = true;
        }
      }
      if (!bVar2) {
        for (ref_private_macro_code_rss = 0; ref_private_macro_code_rss < 3;
            ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
          uVar3 = ref_node_ratio(pRStack_30,ratio._4_4_,
                                 *(REF_INT *)
                                  (*(long *)(allowed_local + 0x10) +
                                  (long)(ref_private_macro_code_rss + skip * 3) * 4),
                                 (REF_DBL *)&face_node);
          if (uVar3 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                   ,0x920,"ref_cavity_ratio",(ulong)uVar3,"ratio");
            return uVar3;
          }
          if ((_face_node < *(double *)(*(long *)&ref_node[1].blank + 0x58)) ||
             (pdVar1 = (double *)(*(long *)&ref_node[1].blank + 0x60),
             *pdVar1 <= _face_node && _face_node != *pdVar1)) {
            *(undefined4 *)&ref_grid->mpi = 0;
            return 0;
          }
        }
      }
    }
    skip = skip + 1;
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_cavity_ratio(REF_CAVITY ref_cavity, REF_BOOL *allowed) {
  REF_GRID ref_grid = ref_cavity_grid(ref_cavity);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT node = ref_cavity_node(ref_cavity);
  REF_DBL ratio;
  REF_INT face, face_node;
  REF_BOOL skip;

  *allowed = REF_TRUE;

  each_ref_cavity_valid_face(ref_cavity, face) {
    skip = REF_FALSE;
    /* skip a collapsed triangle that in on the boundary of cavity */
    each_ref_cavity_face_node(ref_cavity, face_node) {
      if (node == ref_cavity_f2n(ref_cavity, face_node, face)) {
        skip = REF_TRUE;
      }
    }
    if (skip) continue;
    each_ref_cavity_face_node(ref_cavity, face_node) {
      RSS(ref_node_ratio(ref_node, node,
                         ref_cavity_f2n(ref_cavity, face_node, face), &ratio),
          "ratio");
      if (ratio < ref_grid_adapt(ref_grid, post_min_ratio) ||
          ratio > ref_grid_adapt(ref_grid, post_max_ratio)) {
        *allowed = REF_FALSE;
        return REF_SUCCESS;
      }
    }
  }

  return REF_SUCCESS;
}